

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_se(aec_stream_conflict *strm)

{
  uint uVar1;
  int iVar2;
  internal_state_conflict *piVar3;
  byte *pbVar4;
  uint32_t *puVar5;
  long lVar6;
  internal_state_conflict *state;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint32_t uVar12;
  size_t sVar13;
  ulong uVar14;
  uint64_t uVar15;
  bool bVar16;
  
  piVar3 = strm->state;
  if ((strm->avail_in < (ulong)piVar3->in_blklen) || (strm->avail_out < (ulong)piVar3->out_blklen))
  {
    piVar3->mode = m_se_decode;
    piVar3->sample_counter = piVar3->ref;
  }
  else {
    uVar11 = piVar3->ref;
    do {
      uVar9 = uVar11;
      uVar1 = strm->block_size;
      if (uVar1 <= uVar9) {
        piVar3->mode = m_next_cds;
        break;
      }
      if (piVar3->bitp == 0) {
        piVar3->acc = 0;
      }
      else {
        bVar7 = -(char)piVar3->bitp;
        piVar3->acc = (piVar3->acc << (bVar7 & 0x3f)) >> (bVar7 & 0x3f);
      }
      uVar15 = piVar3->acc;
      iVar10 = -0x40;
      if (uVar15 == 0) {
        sVar13 = strm->avail_in;
        uVar8 = 0;
        iVar10 = 0;
        do {
          bVar16 = sVar13 < 7;
          sVar13 = sVar13 - 7;
          if (bVar16) goto LAB_00104f3e;
          pbVar4 = strm->next_in;
          uVar14 = (ulong)pbVar4[5] << 8 |
                   (ulong)pbVar4[4] << 0x10 |
                   (ulong)pbVar4[3] << 0x18 |
                   (ulong)pbVar4[2] << 0x20 | (ulong)pbVar4[1] << 0x28 | (ulong)*pbVar4 << 0x30;
          bVar7 = pbVar4[6];
          piVar3->acc = uVar14 | bVar7;
          strm->next_in = pbVar4 + 7;
          strm->avail_in = sVar13;
          iVar10 = iVar10 + piVar3->bitp;
          uVar15 = uVar14 | bVar7;
          piVar3->bitp = 0x38;
        } while (uVar15 == 0);
        iVar10 = iVar10 + -0x40;
      }
      lVar6 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      iVar2 = piVar3->bitp;
      piVar3->bitp = (uint)lVar6;
      uVar8 = iVar10 + iVar2 + ((uint)lVar6 ^ 0x3f);
LAB_00104f3e:
      uVar11 = uVar9;
      if (uVar8 < 0x5b) {
        uVar12 = uVar8 - piVar3->se_table[(ulong)uVar8 * 2 + 1];
        if ((uVar9 & 1) == 0) {
          iVar10 = piVar3->se_table[uVar8 * 2];
          puVar5 = piVar3->rsip;
          piVar3->rsip = puVar5 + 1;
          *puVar5 = iVar10 - uVar12;
          strm->avail_out = strm->avail_out - (ulong)piVar3->bytes_per_sample;
          uVar11 = uVar9 | 1;
        }
        puVar5 = piVar3->rsip;
        piVar3->rsip = puVar5 + 1;
        *puVar5 = uVar12;
        strm->avail_out = strm->avail_out - (ulong)piVar3->bytes_per_sample;
        uVar11 = uVar11 + 1;
      }
    } while (uVar8 < 0x5b);
    if (uVar9 < uVar1) {
      return -1;
    }
  }
  return 1;
}

Assistant:

static int m_se(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (BUFFERSPACE(strm)) {
        uint32_t i = state->ref;

        while (i < strm->block_size) {
            uint32_t m = direct_get_fs(strm);
            int32_t d1;

            if (m > SE_TABLE_SIZE)
                return M_ERROR;

            d1 = m - state->se_table[2 * m + 1];

            if ((i & 1) == 0) {
                put_sample(strm, state->se_table[2 * m] - d1);
                i++;
            }
            put_sample(strm, d1);
            i++;
        }
        state->mode = m_next_cds;
    } else {
        state->mode = m_se_decode;
        state->sample_counter = state->ref;
    }
    return M_CONTINUE;
}